

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vshasigmaw_ppc64(ppc_avr_t *r,ppc_avr_t *a,uint32_t st_six)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  lVar1 = 3;
  bVar2 = 0;
  do {
    uVar4 = 8 >> (bVar2 & 0x1f);
    uVar3 = a->u32[lVar1];
    if ((st_six & 0x10) == 0) {
      if ((uVar4 & st_six) == 0) {
        uVar4 = (uVar3 << 0xe | uVar3 >> 0x12) ^ (uVar3 << 0x19 | uVar3 >> 7);
        uVar3 = uVar3 >> 3;
      }
      else {
        uVar4 = (uVar3 << 0xd | uVar3 >> 0x13) ^ (uVar3 << 0xf | uVar3 >> 0x11);
        uVar3 = uVar3 >> 10;
      }
    }
    else if ((uVar4 & st_six) == 0) {
      uVar4 = (uVar3 << 0x13 | uVar3 >> 0xd) ^ (uVar3 << 0x1e | uVar3 >> 2);
      uVar3 = uVar3 << 10 | uVar3 >> 0x16;
    }
    else {
      uVar4 = (uVar3 << 0x15 | uVar3 >> 0xb) ^ (uVar3 << 0x1a | uVar3 >> 6);
      uVar3 = uVar3 << 7 | uVar3 >> 0x19;
    }
    r->u32[lVar1] = uVar3 ^ uVar4;
    bVar2 = bVar2 + 1;
    bVar5 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar5);
  return;
}

Assistant:

void helper_vshasigmaw(ppc_avr_t *r,  ppc_avr_t *a, uint32_t st_six)
{
    int st = (st_six & 0x10) != 0;
    int six = st_six & 0xF;
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u32); i++) {
        if (st == 0) {
            if ((six & (0x8 >> i)) == 0) {
                r->VsrW(i) = ror32(a->VsrW(i), 7) ^
                             ror32(a->VsrW(i), 18) ^
                             (a->VsrW(i) >> 3);
            } else { /* six.bit[i] == 1 */
                r->VsrW(i) = ror32(a->VsrW(i), 17) ^
                             ror32(a->VsrW(i), 19) ^
                             (a->VsrW(i) >> 10);
            }
        } else { /* st == 1 */
            if ((six & (0x8 >> i)) == 0) {
                r->VsrW(i) = ror32(a->VsrW(i), 2) ^
                             ror32(a->VsrW(i), 13) ^
                             ror32(a->VsrW(i), 22);
            } else { /* six.bit[i] == 1 */
                r->VsrW(i) = ror32(a->VsrW(i), 6) ^
                             ror32(a->VsrW(i), 11) ^
                             ror32(a->VsrW(i), 25);
            }
        }
    }
}